

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O1

void __thiscall AActorMover::PostBeginPlay(AActorMover *this)

{
  AActor *pAVar1;
  TActorIterator<AActor> iterator;
  TActorIterator<AActor> local_18;
  
  APathFollower::PostBeginPlay(&this->super_APathFollower);
  local_18.super_FActorIterator.id = (this->super_APathFollower).super_AActor.args[3];
  local_18.super_FActorIterator.base = (AActor *)0x0;
  pAVar1 = TActorIterator<AActor>::Next(&local_18);
  (this->super_APathFollower).super_AActor.tracer.field_0.p = pAVar1;
  if (pAVar1 != (AActor *)0x0) {
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar1 = (this->super_APathFollower).super_AActor.tracer.field_0.p;
      (this->super_APathFollower).super_AActor.special1 = (pAVar1->flags).Value;
      (this->super_APathFollower).super_AActor.special2 = (pAVar1->flags2).Value;
      return;
    }
    (this->super_APathFollower).super_AActor.tracer.field_0.p = (AActor *)0x0;
  }
  Printf("ActorMover %d: Can\'t find target %d\n",
         (ulong)(uint)(this->super_APathFollower).super_AActor.tid,
         (ulong)(uint)(this->super_APathFollower).super_AActor.args[3]);
  return;
}

Assistant:

void AActorMover::PostBeginPlay ()
{
	Super::PostBeginPlay ();

	TActorIterator<AActor> iterator (args[3]);
	tracer = iterator.Next ();

	if (tracer == NULL)
	{
		Printf ("ActorMover %d: Can't find target %d\n", tid, args[3]);
	}
	else
	{
		special1 = tracer->flags;
		special2 = tracer->flags2;
	}
}